

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O2

void __thiscall
BitmapIndexBuilder::add_file(BitmapIndexBuilder *this,FileId fid,uint8_t *data,size_t size)

{
  TrigramGenerator p_Var1;
  out_of_range *this_00;
  FileId fid_local;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  fid_local = fid;
  if (fid < 8) {
    p_Var1 = get_generator_for((this->super_IndexBuilder).ntype);
    local_38._8_8_ = &fid_local;
    local_20 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/BitmapIndexBuilder.cpp:70:27)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/BitmapIndexBuilder.cpp:70:27)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    (*p_Var1)(data,size,(TrigramCallback *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"fid");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void BitmapIndexBuilder::add_file(FileId fid, const uint8_t *data,
                                  size_t size) {
    if (fid >= max_files) {
        // IndexBuilder's bitmap can't hold more than max_files files
        throw std::out_of_range("fid");
    }

    TrigramGenerator generator = get_generator_for(index_type());
    generator(data, size, [&](TriGram val) { add_trigram(fid, val); });
}